

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O0

filehandle * __thiscall filehandle::operator=(filehandle *this,int fh)

{
  int __v;
  system_error *this_00;
  int *piVar1;
  error_category *__ecat;
  shared_ptr<filehandle::ptr> local_38 [2];
  int local_14;
  filehandle *pfStack_10;
  int fh_local;
  filehandle *this_local;
  
  local_14 = fh;
  pfStack_10 = this;
  if (fh == -1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar1 = __errno_location();
    __v = *piVar1;
    __ecat = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,__v,__ecat);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::make_shared<filehandle::ptr,int&>((int *)local_38);
  std::shared_ptr<filehandle::ptr>::operator=(&this->_p,local_38);
  std::shared_ptr<filehandle::ptr>::~shared_ptr(local_38);
  return this;
}

Assistant:

filehandle& operator=(int fh)
    { 
        if (fh==-1)
            throw std::system_error(errno, std::generic_category());
        _p = std::make_shared<ptr>(fh);
        return *this;
    }